

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cpp
# Opt level: O2

ostream * masc::polygon::operator<<(ostream *os,c_ply *p)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ply_vertex *ppVar4;
  char *pcVar5;
  undefined4 extraout_var_01;
  
  iVar1 = c_ply::getSize(p);
  poVar3 = (ostream *)std::ostream::operator<<(os,iVar1);
  poVar3 = std::operator<<(poVar3," ");
  pcVar5 = "out";
  if (p->type == PIN) {
    pcVar5 = "in";
  }
  poVar3 = std::operator<<(poVar3,pcVar5);
  std::operator<<(poVar3,"\n");
  ppVar4 = p->head;
  do {
    iVar1 = (*ppVar4->_vptr_ply_vertex[2])(ppVar4);
    poVar3 = std::ostream::_M_insert<double>(*(double *)CONCAT44(extraout_var,iVar1));
    std::operator<<(poVar3," ");
    iVar1 = (*ppVar4->_vptr_ply_vertex[2])(ppVar4);
    poVar3 = std::ostream::_M_insert<double>(*(double *)(CONCAT44(extraout_var_00,iVar1) + 8));
    std::operator<<(poVar3,"\n");
    iVar1 = (*ppVar4->_vptr_ply_vertex[3])(ppVar4);
    ppVar4 = (ply_vertex *)CONCAT44(extraout_var_01,iVar1);
  } while (ppVar4 != p->head);
  iVar1 = 1;
  while( true ) {
    iVar2 = c_ply::getSize(p);
    if (iVar2 <= iVar1 + -1) break;
    poVar3 = (ostream *)std::ostream::operator<<(os,iVar1);
    std::operator<<(poVar3," ");
    iVar1 = iVar1 + 1;
  }
  std::operator<<(os,"\n");
  return os;
}

Assistant:

ostream& operator<<( ostream& os, c_ply& p)
{
    os<<p.getSize()<<" "<<((p.type==c_ply::PIN)?"in":"out")<<"\n";
    ply_vertex * ptr=p.head;
    do{
        os<<ptr->getPos()[0]<<" "<<ptr->getPos()[1]<<"\n";
        ptr=ptr->getNext();
    }while(ptr!=p.head);

    for(int i=0;i<p.getSize();i++) os<<i+1<<" ";
    os<<"\n";
    return os;
}